

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BitMatrix.h
# Opt level: O2

BitMatrix *
ZXing::ToBitMatrix<ZXing::Trit>
          (BitMatrix *__return_storage_ptr__,Matrix<ZXing::Trit> *in,Trit trueValue)

{
  int x;
  int x_00;
  int y;
  int y_00;
  
  BitMatrix::BitMatrix(__return_storage_ptr__,in->_width,in->_height);
  for (y_00 = 0; y_00 < in->_height; y_00 = y_00 + 1) {
    for (x_00 = 0; x_00 < in->_width; x_00 = x_00 + 1) {
      if (((in->_data).super__Vector_base<ZXing::Trit,_std::allocator<ZXing::Trit>_>._M_impl.
           super__Vector_impl_data._M_start[in->_width * y_00 + x_00].value == true_v) ==
          (trueValue.value == true_v)) {
        BitMatrix::set(__return_storage_ptr__,x_00,y_00,true);
      }
    }
  }
  return __return_storage_ptr__;
}

Assistant:

BitMatrix ToBitMatrix(const Matrix<T>& in, T trueValue = {true})
{
	BitMatrix out(in.width(), in.height());
	for (int y = 0; y < in.height(); ++y)
		for (int x = 0; x < in.width(); ++x)
			if (in.get(x, y) == trueValue)
				out.set(x, y);
	return out;
}